

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O3

void __thiscall
cmGlobalGenerator::AddGlobalTarget_Install
          (cmGlobalGenerator *this,
          vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
          *targets)

{
  pointer puVar1;
  __uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_> _Var2;
  cmake *this_00;
  pointer pcVar3;
  string_view sep;
  vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  *pvVar4;
  _Alloc_hider _Var5;
  pointer pcVar6;
  pointer pcVar7;
  bool bVar8;
  int iVar9;
  undefined4 extraout_var;
  string *psVar10;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  cmValue cVar11;
  char *pcVar12;
  char *pcVar13;
  long lVar14;
  undefined1 auVar15 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  string_view prefix;
  string_view value;
  string_view suffix;
  string cfgArg;
  cmCustomCommandLine localCmdLine;
  cmCustomCommandLine singleLine;
  string cmd;
  GlobalTargetInfo gti;
  string local_2b0;
  vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  *local_290;
  string local_288;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_268;
  char *local_250;
  undefined1 local_248 [32];
  _Alloc_hider local_228;
  size_type local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  pointer local_1f8;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  _Stack_1f0;
  size_type local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  bool local_1b8;
  PerConfig local_1b4;
  bool local_1b0;
  undefined1 local_1a8 [8];
  char *local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  _Alloc_hider local_188;
  char *local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_168;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_150;
  _Alloc_hider local_138;
  size_type local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  bool local_118;
  PerConfig local_114;
  bool local_110;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  
  puVar1 = (this->Makefiles).
           super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar9 = (*this->_vptr_cmGlobalGenerator[0x17])();
  local_250 = (char *)CONCAT44(extraout_var,iVar9);
  _Var2._M_t.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
  super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl =
       (puVar1->_M_t).super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t;
  local_1a8 = (undefined1  [8])&local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CMAKE_SKIP_INSTALL_RULES","")
  ;
  bVar8 = cmMakefile::IsOn((cmMakefile *)
                           _Var2._M_t.
                           super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
                           super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,
                           (string *)local_1a8);
  if (local_1a8 != (undefined1  [8])&local_198) {
    operator_delete((void *)local_1a8,
                    CONCAT71(local_198._M_allocated_capacity._1_7_,local_198._M_local_buf[0]) + 1);
  }
  if ((bVar8 & this->InstallTargetEnabled) == 1) {
    this_00 = this->CMakeInstance;
    local_1a8 = (undefined1  [8])&local_198;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,
               "CMAKE_SKIP_INSTALL_RULES was enabled even though installation rules have been specified"
               ,"");
    cmMakefile::GetBacktrace
              ((cmMakefile *)
               (puVar1->_M_t).super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>.
               _M_t);
    cmake::IssueMessage(this_00,WARNING,(string *)local_1a8,(cmListFileBacktrace *)local_248);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._8_8_);
    }
    if (local_1a8 == (undefined1  [8])&local_198) {
      return;
    }
    lVar14 = CONCAT71(local_198._M_allocated_capacity._1_7_,local_198._M_local_buf[0]);
    auVar15 = local_1a8;
  }
  else {
    if (bVar8 || this->InstallTargetEnabled != true) {
      return;
    }
    local_290 = targets;
    if (((local_250 == (char *)0x0) || (*local_250 == '.')) || (*local_250 == '\0')) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      if ((this->InstallComponents)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Only default component available",0x20);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Available install components are: ",0x22);
        local_288._M_dataplus._M_p._0_1_ = 0x22;
        local_268.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT71(local_268.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._1_7_,0x22);
        local_2b0._M_dataplus._M_p = (pointer)0x1;
        local_2b0._M_string_length = 0x845575;
        sep._M_str = " ";
        sep._M_len = 1;
        prefix._M_str = (char *)&local_288;
        prefix._M_len = 1;
        suffix._M_str = (char *)&local_268;
        suffix._M_len = 1;
        cmWrap<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                  ((string *)local_248,prefix,&this->InstallComponents,suffix,sep);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(char *)local_248._0_8_,local_248._8_8_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_248 + 0x10)) {
          operator_delete((void *)local_248._0_8_,CONCAT71(local_248._17_7_,local_248[0x10]) + 1);
        }
      }
      local_248._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_248[0x10] = '\0';
      local_220 = 0;
      local_218._M_local_buf[0] = '\0';
      local_208._M_allocated_capacity = 0;
      local_208._8_8_ = (pointer)0x0;
      local_1f8 = (pointer)0x0;
      _Stack_1f0._M_value._M_dataplus._M_p = (_Alloc_hider)(pointer)0x0;
      _Stack_1f0._M_value._M_string_length = 0;
      _Stack_1f0._16_8_ = (pointer)0x0;
      local_1d0 = 0;
      local_1c8._M_local_buf[0] = '\0';
      local_1b8 = false;
      local_1b4 = Yes;
      local_1b0 = false;
      local_248._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_248 + 0x10);
      local_228._M_p = (pointer)&local_218;
      _Stack_1f0._24_8_ = &local_1c8;
      std::__cxx11::string::_M_replace((ulong)local_248,0,(char *)0x0,0x816e52);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)(local_248 + 0x20),(string *)&local_2b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
      }
      local_1b8 = false;
      std::
      vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
      ::emplace_back<cmGlobalGenerator::GlobalTargetInfo>(local_290,(GlobalTargetInfo *)local_248);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Stack_1f0._24_8_ != &local_1c8) {
        operator_delete((void *)_Stack_1f0._24_8_,
                        CONCAT71(local_1c8._M_allocated_capacity._1_7_,local_1c8._M_local_buf[0]) +
                        1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&_Stack_1f0._M_value);
      std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector
                ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)&local_208);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_p != &local_218) {
        operator_delete(local_228._M_p,
                        CONCAT71(local_218._M_allocated_capacity._1_7_,local_218._M_local_buf[0]) +
                        1);
      }
      targets = local_290;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_248 + 0x10)) {
        operator_delete((void *)local_248._0_8_,CONCAT71(local_248._17_7_,local_248[0x10]) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)&local_138);
    }
    psVar10 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    local_248._0_8_ = local_248 + 0x10;
    pcVar3 = (psVar10->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_248,pcVar3,pcVar3 + psVar10->_M_string_length);
    local_188._M_p = (pointer)&local_178;
    local_1a8 = (undefined1  [8])&local_198;
    local_1a0 = (char *)0x0;
    local_198._M_local_buf[0] = '\0';
    local_180 = (char *)0x0;
    local_178._M_local_buf[0] = '\0';
    local_138._M_p = (pointer)&local_128;
    local_168.super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_168.super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_168.super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vStack_150.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_150.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_150.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_130 = 0;
    local_128._M_local_buf[0] = '\0';
    local_118 = false;
    local_114 = Yes;
    local_110 = false;
    iVar9 = (*this->_vptr_cmGlobalGenerator[0x1c])(this);
    pcVar13 = local_1a0;
    strlen((char *)CONCAT44(extraout_var_00,iVar9));
    std::__cxx11::string::_M_replace((ulong)local_1a8,0,pcVar13,CONCAT44(extraout_var_00,iVar9));
    std::__cxx11::string::_M_replace((ulong)&local_188,0,local_180,0x816e6a);
    local_118 = true;
    local_110 = true;
    local_268.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_268.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_268.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar9 = (*this->_vptr_cmGlobalGenerator[0x1f])(this);
    paVar17 = &local_2b0.field_2;
    if (CONCAT44(extraout_var_01,iVar9) == 0) {
      _Var2._M_t.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
      super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl =
           (puVar1->_M_t).super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t;
      local_2b0._M_dataplus._M_p = (pointer)paVar17;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2b0,"CMAKE_SKIP_INSTALL_ALL_DEPENDENCY","");
      cVar11 = cmMakefile::GetDefinition
                         ((cmMakefile *)
                          _Var2._M_t.
                          super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
                          super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,&local_2b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != paVar17) {
        operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
      }
      if ((cVar11.Value == (string *)0x0) ||
         (value._M_str = ((cVar11.Value)->_M_dataplus)._M_p,
         value._M_len = (cVar11.Value)->_M_string_length, bVar8 = cmValue::IsOff(value), bVar8)) {
        iVar9 = (*this->_vptr_cmGlobalGenerator[0x1b])(this);
        local_2b0._M_dataplus._M_p = (pointer)CONCAT44(extraout_var_03,iVar9);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const*>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&vStack_150,
                   (char **)&local_2b0);
      }
    }
    else {
      iVar9 = (*this->_vptr_cmGlobalGenerator[0x1f])(this);
      local_2b0._M_dataplus._M_p = (pointer)CONCAT44(extraout_var_02,iVar9);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&vStack_150,
                 (char **)&local_2b0);
    }
    _Var2._M_t.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
    super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl =
         (puVar1->_M_t).super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t;
    local_2b0._M_dataplus._M_p = (pointer)paVar17;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"CMake_BINARY_DIR","");
    cVar11 = cmMakefile::GetDefinition
                       ((cmMakefile *)
                        _Var2._M_t.
                        super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
                        super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,&local_2b0);
    if (cVar11.Value == (string *)0x0) {
      bVar8 = false;
    }
    else {
      _Var2._M_t.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
      super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl =
           (puVar1->_M_t).super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t;
      local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_288,"CMAKE_CROSSCOMPILING","");
      bVar8 = cmMakefile::IsOn((cmMakefile *)
                               _Var2._M_t.
                               super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>
                               .super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,&local_288);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != &local_288.field_2) {
        operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
      }
      bVar8 = !bVar8;
    }
    paVar17 = &local_2b0.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != paVar17) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
    if (bVar8) {
      std::__cxx11::string::_M_replace((ulong)local_248,0,(char *)local_248._8_8_,0x830837);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_268,(value_type *)local_248);
    if (((local_250 != (char *)0x0) && (*local_250 != '\0')) && (*local_250 != '.')) {
      local_2b0._M_dataplus._M_p = (pointer)paVar17;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"-DBUILD_TYPE=","");
      iVar9 = (*this->_vptr_cmGlobalGenerator[0x31])
                        (this,(_Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>)
                              (puVar1->_M_t).
                              super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>.
                              _M_t);
      if ((char)iVar9 == '\0') {
        (*this->_vptr_cmGlobalGenerator[0x17])(this);
        std::__cxx11::string::append((char *)&local_2b0);
      }
      else {
        std::__cxx11::string::append((char *)&local_2b0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_268,&local_2b0);
        std::__cxx11::string::_M_replace
                  ((ulong)&local_2b0,0,(char *)local_2b0._M_string_length,0x816ee8);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_268,&local_2b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != paVar17) {
        operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
      }
    }
    local_2b0._M_dataplus._M_p = (pointer)paVar17;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"-P","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_268,
               &local_2b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != paVar17) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
    local_2b0._M_dataplus._M_p = (pointer)paVar17;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"cmake_install.cmake","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_268,
               &local_2b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != paVar17) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
              (&local_168,(value_type *)&local_268);
    std::
    vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
    ::push_back(targets,(value_type *)local_1a8);
    iVar9 = (*this->_vptr_cmGlobalGenerator[0x1d])(this);
    pcVar13 = local_1a0;
    pcVar12 = (char *)CONCAT44(extraout_var_04,iVar9);
    if (pcVar12 != (char *)0x0) {
      strlen(pcVar12);
      std::__cxx11::string::_M_replace((ulong)local_1a8,0,pcVar13,(ulong)pcVar12);
      std::__cxx11::string::_M_replace((ulong)&local_188,0,local_180,0x816f1d);
      pcVar7 = local_168.
               super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl
               .super__Vector_impl_data._M_finish;
      pcVar6 = local_168.
               super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl
               .super__Vector_impl_data._M_start;
      local_118 = true;
      pvVar16 = &(local_168.
                  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                  _M_impl.super__Vector_impl_data._M_start)->
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ;
      if (local_168.super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          local_168.super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        do {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(pvVar16);
          pvVar16 = pvVar16 + 1;
        } while (pvVar16 !=
                 &pcVar7->
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                );
        local_168.super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
        _M_impl.super__Vector_impl_data._M_finish = pcVar6;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_288,&local_268);
      _Var5._M_p = local_288._M_dataplus._M_p;
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2b0,"-DCMAKE_INSTALL_LOCAL_ONLY=1","");
      pvVar4 = local_290;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_insert_rval((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_288,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (_Var5._M_p + 0x20),&local_2b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
      }
      std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::
      emplace_back<cmCustomCommandLine>(&local_168,(cmCustomCommandLine *)&local_288);
      std::
      vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
      ::push_back(pvVar4,(value_type *)local_1a8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_288);
    }
    iVar9 = (*this->_vptr_cmGlobalGenerator[0x1e])(this);
    pcVar13 = (char *)CONCAT44(extraout_var_05,iVar9);
    if (pcVar13 != (char *)0x0) {
      _Var2._M_t.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
      super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl =
           (puVar1->_M_t).super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t;
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"CMAKE_STRIP","");
      bVar8 = cmMakefile::IsSet((cmMakefile *)
                                _Var2._M_t.
                                super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>
                                .super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,&local_2b0)
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
      }
      pcVar12 = local_1a0;
      if (bVar8) {
        strlen(pcVar13);
        std::__cxx11::string::_M_replace((ulong)local_1a8,0,pcVar12,(ulong)pcVar13);
        std::__cxx11::string::_M_replace((ulong)&local_188,0,local_180,0x816f6d);
        pcVar7 = local_168.
                 super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        pcVar6 = local_168.
                 super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        local_118 = true;
        pvVar16 = &(local_168.
                    super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                    _M_impl.super__Vector_impl_data._M_start)->
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ;
        if (local_168.super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            local_168.super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          do {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(pvVar16);
            pvVar16 = pvVar16 + 1;
          } while (pvVar16 !=
                   &pcVar7->
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  );
          local_168.super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
          _M_impl.super__Vector_impl_data._M_finish = pcVar6;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_288,&local_268);
        _Var5._M_p = local_288._M_dataplus._M_p;
        local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2b0,"-DCMAKE_INSTALL_DO_STRIP=1","");
        pvVar4 = local_290;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_insert_rval((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_288,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (_Var5._M_p + 0x20),&local_2b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
          operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
        }
        std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::
        emplace_back<cmCustomCommandLine>(&local_168,(cmCustomCommandLine *)&local_288);
        std::
        vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
        ::push_back(pvVar4,(value_type *)local_1a8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_288);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_268);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_p != &local_128) {
      operator_delete(local_138._M_p,
                      CONCAT71(local_128._M_allocated_capacity._1_7_,local_128._M_local_buf[0]) + 1)
      ;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&vStack_150);
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_168);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_p != &local_178) {
      operator_delete(local_188._M_p,
                      CONCAT71(local_178._M_allocated_capacity._1_7_,local_178._M_local_buf[0]) + 1)
      ;
    }
    if (local_1a8 != (undefined1  [8])&local_198) {
      operator_delete((void *)local_1a8,
                      CONCAT71(local_198._M_allocated_capacity._1_7_,local_198._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_248 + 0x10)) {
      return;
    }
    lVar14 = CONCAT71(local_248._17_7_,local_248[0x10]);
    auVar15 = (undefined1  [8])local_248._0_8_;
  }
  operator_delete((void *)auVar15,lVar14 + 1);
  return;
}

Assistant:

void cmGlobalGenerator::AddGlobalTarget_Install(
  std::vector<GlobalTargetInfo>& targets)
{
  auto& mf = this->Makefiles[0];
  const char* cmakeCfgIntDir = this->GetCMakeCFGIntDir();
  bool skipInstallRules = mf->IsOn("CMAKE_SKIP_INSTALL_RULES");
  if (this->InstallTargetEnabled && skipInstallRules) {
    this->CMakeInstance->IssueMessage(
      MessageType::WARNING,
      "CMAKE_SKIP_INSTALL_RULES was enabled even though "
      "installation rules have been specified",
      mf->GetBacktrace());
  } else if (this->InstallTargetEnabled && !skipInstallRules) {
    if (!(cmNonempty(cmakeCfgIntDir) && cmakeCfgIntDir[0] != '.')) {
      std::set<std::string>* componentsSet = &this->InstallComponents;
      std::ostringstream ostr;
      if (!componentsSet->empty()) {
        ostr << "Available install components are: ";
        ostr << cmWrap('"', *componentsSet, '"', " ");
      } else {
        ostr << "Only default component available";
      }
      GlobalTargetInfo gti;
      gti.Name = "list_install_components";
      gti.Message = ostr.str();
      gti.UsesTerminal = false;
      targets.push_back(std::move(gti));
    }
    std::string cmd = cmSystemTools::GetCMakeCommand();
    GlobalTargetInfo gti;
    gti.Name = this->GetInstallTargetName();
    gti.Message = "Install the project...";
    gti.UsesTerminal = true;
    gti.StdPipesUTF8 = true;
    cmCustomCommandLine singleLine;
    if (this->GetPreinstallTargetName()) {
      gti.Depends.emplace_back(this->GetPreinstallTargetName());
    } else {
      cmValue noall = mf->GetDefinition("CMAKE_SKIP_INSTALL_ALL_DEPENDENCY");
      if (noall.IsOff()) {
        gti.Depends.emplace_back(this->GetAllTargetName());
      }
    }
    if (mf->GetDefinition("CMake_BINARY_DIR") &&
        !mf->IsOn("CMAKE_CROSSCOMPILING")) {
      // We are building CMake itself.  We cannot use the original
      // executable to install over itself.  The generator will
      // automatically convert this name to the build-time location.
      cmd = "cmake";
    }
    singleLine.push_back(cmd);
    if (cmNonempty(cmakeCfgIntDir) && cmakeCfgIntDir[0] != '.') {
      std::string cfgArg = "-DBUILD_TYPE=";
      bool useEPN = this->UseEffectivePlatformName(mf.get());
      if (useEPN) {
        cfgArg += "$(CONFIGURATION)";
        singleLine.push_back(cfgArg);
        cfgArg = "-DEFFECTIVE_PLATFORM_NAME=$(EFFECTIVE_PLATFORM_NAME)";
      } else {
        cfgArg += this->GetCMakeCFGIntDir();
      }
      singleLine.push_back(cfgArg);
    }
    singleLine.push_back("-P");
    singleLine.push_back("cmake_install.cmake");
    gti.CommandLines.push_back(singleLine);
    targets.push_back(gti);

    // install_local
    if (const char* install_local = this->GetInstallLocalTargetName()) {
      gti.Name = install_local;
      gti.Message = "Installing only the local directory...";
      gti.UsesTerminal = true;
      gti.CommandLines.clear();

      cmCustomCommandLine localCmdLine = singleLine;

      localCmdLine.insert(localCmdLine.begin() + 1,
                          "-DCMAKE_INSTALL_LOCAL_ONLY=1");

      gti.CommandLines.push_back(std::move(localCmdLine));
      targets.push_back(gti);
    }

    // install_strip
    const char* install_strip = this->GetInstallStripTargetName();
    if ((install_strip != nullptr) && (mf->IsSet("CMAKE_STRIP"))) {
      gti.Name = install_strip;
      gti.Message = "Installing the project stripped...";
      gti.UsesTerminal = true;
      gti.CommandLines.clear();

      cmCustomCommandLine stripCmdLine = singleLine;

      stripCmdLine.insert(stripCmdLine.begin() + 1,
                          "-DCMAKE_INSTALL_DO_STRIP=1");
      gti.CommandLines.push_back(std::move(stripCmdLine));
      targets.push_back(gti);
    }
  }
}